

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread.h
# Opt level: O3

void __thiscall cppnet::Thread::Start(Thread *this)

{
  thread *this_00;
  _Bind<void_(cppnet::Thread::*(cppnet::Thread_*))()> local_28;
  
  LOCK();
  (this->_stop)._M_base._M_i = false;
  UNLOCK();
  if ((this->_thread)._M_t.super___uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>.
      _M_t.super__Tuple_impl<0UL,_std::thread_*,_std::default_delete<std::thread>_>.
      super__Head_base<0UL,_std::thread_*,_false>._M_head_impl == (thread *)0x0) {
    this_00 = (thread *)operator_new(8);
    local_28._M_f = 0x29;
    local_28._8_8_ = 0;
    local_28._M_bound_args.super__Tuple_impl<0UL,_cppnet::Thread_*>.
    super__Head_base<0UL,_cppnet::Thread_*,_false>._M_head_impl =
         (_Tuple_impl<0UL,_cppnet::Thread_*>)(_Tuple_impl<0UL,_cppnet::Thread_*>)this;
    std::thread::thread<std::_Bind<void(cppnet::Thread::*(cppnet::Thread*))()>,,void>
              (this_00,&local_28);
    std::__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_>::reset
              ((__uniq_ptr_impl<std::thread,_std::default_delete<std::thread>_> *)&this->_thread,
               this_00);
  }
  return;
}

Assistant:

virtual void Start() {
        _stop = false;
        if (!_thread) {
            _thread = std::unique_ptr<std::thread>(new std::thread(std::bind(&Thread::Run, this)));
        }
    }